

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O1

size_t __thiscall Lodtalk::MethodAssembler::SendMessage::computeMaxSize(SendMessage *this)

{
  size_t extraout_RAX;
  undefined7 uVar1;
  undefined1 uVar2;
  
  uVar1 = (undefined7)((ulong)this >> 8);
  uVar2 = (uint)this->argumentCount < 3;
  if ((bool)uVar2 && this->selectorIndex < 0x10) {
    return 1;
  }
  if (this->argumentCount < 8) {
    if (this->selectorIndex < 0x20) {
      return 2;
    }
  }
  else {
    computeMaxSize();
  }
  computeMaxSize();
  operator_delete((void *)CONCAT71(uVar1,uVar2));
  return extraout_RAX;
}

Assistant:

virtual size_t computeMaxSize()
	{
		if((argumentCount == 0 && selectorIndex < BytecodeSet::SendShortArgs0RangeSize) ||
			(argumentCount == 1 && selectorIndex < BytecodeSet::SendShortArgs1RangeSize) ||
			(argumentCount == 2 && selectorIndex < BytecodeSet::SendShortArgs2RangeSize))
			return 1;

		size_t count = 2;

		if(argumentCount > BytecodeSet::Send_ArgumentCountMask)
			LODTALK_UNIMPLEMENTED();

 		if(selectorIndex > BytecodeSet::Send_LiteralIndexMask)
			LODTALK_UNIMPLEMENTED();
		return count;
	}